

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall
Catch::Session::applyCommandLine(Session *this,int argc,char **argv,DoWhat unusedOptionBehaviour)

{
  undefined4 in_register_0000000c;
  char **argv_00;
  Colour colourGuard;
  exception *ex;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> local_58;
  DoWhat local_2c;
  char **ppcStack_28;
  DoWhat unusedOptionBehaviour_local;
  char **argv_local;
  Session *pSStack_18;
  int argc_local;
  Session *this_local;
  
  argv_00 = (char **)CONCAT44(in_register_0000000c,unusedOptionBehaviour);
  local_2c = unusedOptionBehaviour;
  ppcStack_28 = argv;
  argv_local._4_4_ = argc;
  pSStack_18 = this;
  Clara::CommandLine<Catch::ConfigData>::setThrowOnUnrecognisedTokens
            (&this->m_cli,unusedOptionBehaviour == Fail);
  Clara::argsToVector_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ex,(Clara *)(ulong)argv_local._4_4_,(int)ppcStack_28,argv_00);
  Clara::CommandLine<Catch::ConfigData>::parseInto
            (&local_58,&this->m_cli,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ex,&this->m_configData);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::operator=
            (&this->m_unusedTokens,&local_58);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            (&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ex);
  if (((this->m_configData).showHelp & 1U) != 0) {
    showHelp(this,&(this->m_configData).processName);
  }
  Ptr<Catch::Config>::reset(&this->m_config);
  return 0;
}

Assistant:

int applyCommandLine( int argc, char const* const* const argv, OnUnusedOptions::DoWhat unusedOptionBehaviour = OnUnusedOptions::Fail ) {
            try {
                m_cli.setThrowOnUnrecognisedTokens( unusedOptionBehaviour == OnUnusedOptions::Fail );
                m_unusedTokens = m_cli.parseInto( Clara::argsToVector( argc, argv ), m_configData );
                if( m_configData.showHelp )
                    showHelp( m_configData.processName );
                m_config.reset();
            }
            catch( std::exception& ex ) {
                {
                    Colour colourGuard( Colour::Red );
                    Catch::cerr()
                        << "\nError(s) in input:\n"
                        << Text( ex.what(), TextAttributes().setIndent(2) )
                        << "\n\n";
                }
                m_cli.usage( Catch::cout(), m_configData.processName );
                return (std::numeric_limits<int>::max)();
            }
            return 0;
        }